

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_get_attribute_list
          (exr_const_context_t ctxt,int part_index,exr_attr_list_access_mode_t mode,int32_t *count,
          exr_attribute_t **outlist)

{
  long lVar1;
  exr_result_t eVar2;
  long lVar3;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar2 = 2;
  }
  else {
    if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
      eVar2 = (**(code **)(ctxt + 0x48))
                        (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
      return eVar2;
    }
    if (count == (int32_t *)0x0) {
LAB_0011555a:
      eVar2 = (**(code **)(ctxt + 0x38))(ctxt,3);
      return eVar2;
    }
    lVar1 = *(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
    if (mode == EXR_ATTR_LIST_SORTED_ORDER) {
      lVar3 = 0x18;
    }
    else {
      if (mode != EXR_ATTR_LIST_FILE_ORDER) goto LAB_0011555a;
      lVar3 = 0x10;
    }
    if ((outlist != (exr_attribute_t **)0x0) && (*(int *)(lVar1 + 8) <= *count)) {
      memcpy(outlist,*(void **)(lVar1 + lVar3),(long)*(int *)(lVar1 + 8) << 3);
    }
    *count = *(int32_t *)(lVar1 + 8);
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_get_attribute_list (
    exr_const_context_t         ctxt,
    int                         part_index,
    exr_attr_list_access_mode_t mode,
    int32_t*                    count,
    const exr_attribute_t**     outlist)
{
    exr_attribute_t** srclist;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!count)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (mode == EXR_ATTR_LIST_SORTED_ORDER)
        srclist = part->attributes.sorted_entries;
    else if (mode == EXR_ATTR_LIST_FILE_ORDER)
        srclist = part->attributes.entries;
    else
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (outlist && *count >= part->attributes.num_attributes)
        memcpy (
            EXR_CONST_CAST (exr_attribute_t**, outlist),
            srclist,
            sizeof (exr_attribute_t*) *
                (size_t) part->attributes.num_attributes);
    *count = part->attributes.num_attributes;
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}